

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O3

void __thiscall Z80::OpCode_LR35902_LDD(Z80 *this)

{
  bool bVar1;
  char cVar2;
  Z80Reg ZVar3;
  Z80Reg ZVar4;
  char **ppcVar5;
  int local_28 [2];
  
  do {
    local_28[0] = -1;
    local_28[1] = -1;
    ZVar3 = GetRegister((char **)this);
    ppcVar5 = &lp;
    bVar1 = comma(&lp);
    ZVar4 = Z80_UNK;
    if (bVar1) {
      ZVar4 = GetRegister(ppcVar5);
    }
    if (ZVar4 == Z80_A && ZVar3 == Z80_MEM_HL || ZVar4 == Z80_MEM_HL && ZVar3 == Z80_A) {
      local_28[0] = (uint)(ZVar4 == Z80_MEM_HL && ZVar3 == Z80_A) * 8 + 0x32;
    }
    EmitBytes(local_28,true);
    ppcVar5 = &lp;
    cVar2 = (*DAT_0018e520)();
    this = (Z80 *)ppcVar5;
  } while (cVar2 != '\0');
  return;
}

Assistant:

static void OpCode_LR35902_LDD() {
		// ldd (hl),a = ld (hl-),a = 0x32
		// ldd a,(hl) = ld a,(hl-) = 0x3A
		do {
			int e[] { -1, -1 };
			const Z80Reg r1 = GetRegister(lp);
			const bool comma_ok = comma(lp);
			const Z80Reg r2 = comma_ok ? GetRegister(lp) : Z80_UNK;
			if (Z80_MEM_HL == r1 && Z80_A == r2) e[0] = 0x32;
			if (Z80_A == r1 && Z80_MEM_HL == r2) e[0] = 0x3A;
			EmitBytes(e, true);
		} while (Options::syx.MultiArg(lp));
	}